

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

int CVmBifTADS::re_match
              (re_pattern_buffer *__buffer,char *__string,int __length,int __start,
              re_registers *__regs)

{
  vm_globalvar_t *pvVar1;
  undefined4 uVar2;
  int iVar3;
  int extraout_EAX;
  vm_val_t *val;
  vm_val_t *val_00;
  vm_val_t *pvVar4;
  CRegexSearcherSimple *pCVar5;
  size_t sVar6;
  vm_val_t pat_val;
  char *pat_str;
  CVmObjPattern *pat_obj;
  int start_idx;
  vm_val_t *v3;
  vm_val_t *v2;
  vm_val_t *v1;
  int match_len;
  size_t len;
  utf8_ptr p;
  char *str;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  CRegexSearcherSimple *in_stack_ffffffffffffff50;
  size_t *in_stack_ffffffffffffff58;
  utf8_ptr *in_stack_ffffffffffffff60;
  re_compiled_pattern *in_stack_ffffffffffffff68;
  int local_74;
  vm_val_t *local_70;
  vm_val_t local_68;
  char *local_58;
  CVmObject *local_50;
  undefined4 in_stack_ffffffffffffffb8;
  vm_obj_id_t vVar7;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  utf8_ptr local_18;
  char *local_10;
  uint local_4;
  
  local_4 = (uint)__buffer;
  utf8_ptr::utf8_ptr(&local_18);
  local_50 = (CVmObject *)0x0;
  local_58 = (char *)0x0;
  CVmBif::check_argc_range
            ((uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),(uint)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c);
  val = CVmStack::get(0);
  val_00 = CVmStack::get(1);
  if (local_4 < 3) {
    local_70 = (vm_val_t *)0x0;
  }
  else {
    local_70 = CVmStack::get(2);
  }
  CVmStack::push(val_00);
  CVmStack::push(val);
  vVar7 = 1;
  if (local_70 != (vm_val_t *)0x0) {
    if (local_70->typ != VM_INT) {
      err_throw(0);
    }
    vVar7 = (local_70->val).obj;
  }
  pvVar1 = G_bif_tads_globals_X->last_rex_str;
  uVar2 = *(undefined4 *)&val_00->field_0x4;
  (pvVar1->val).typ = val_00->typ;
  *(undefined4 *)&(pvVar1->val).field_0x4 = uVar2;
  (pvVar1->val).val = val_00->val;
  CRegexSearcherSimple::clear_group_regs((CRegexSearcherSimple *)0x2a4c85);
  pvVar4 = CVmStack::get(0);
  if (pvVar4->typ == VM_OBJ) {
    CVmStack::get(0);
    iVar3 = CVmObjPattern::is_pattern_obj(0);
    if (iVar3 != 0) {
      CVmStack::pop(&local_68);
      local_50 = vm_objp(0);
      goto LAB_002a4ccd;
    }
  }
  local_58 = CVmBif::pop_str_val();
LAB_002a4ccd:
  local_10 = CVmBif::pop_str_val();
  pCVar5 = (CRegexSearcherSimple *)vmb_get_len((char *)0x2a4ce7);
  utf8_ptr::set(&local_18,local_10 + 2);
  if ((int)vVar7 < 0) {
    sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff50,
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_74 = (int)sVar6;
  }
  else {
    local_74 = -1;
  }
  local_74 = local_74 + vVar7;
  while (0 < local_74 && pCVar5 != (CRegexSearcherSimple *)0x0) {
    local_74 = local_74 + -1;
    utf8_ptr::inc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  if (local_50 == (CVmObject *)0x0) {
    in_stack_ffffffffffffff50 = G_bif_tads_globals_X->rex_searcher;
    vmb_get_len((char *)0x2a4e27);
    utf8_ptr::getptr(&local_18);
    iVar3 = CRegexSearcherSimple::compile_and_match
                      (pCVar5,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (size_t)val,(char *)val_00,(char *)local_70,
                       CONCAT44(local_74,in_stack_ffffffffffffffb8));
  }
  else {
    pCVar5 = G_bif_tads_globals_X->rex_searcher;
    CVmObjPattern::get_pattern((CVmObjPattern *)0x2a4db1);
    utf8_ptr::getptr(&local_18);
    iVar3 = CRegexSearcherSimple::match_pattern
                      (pCVar5,in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                       (char *)in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  }
  if (iVar3 < 0) {
    CVmBif::retval_nil();
  }
  else {
    utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff50,
                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    CVmBif::retval_int(0x2a4e9c);
  }
  CVmStack::discard(local_4);
  return extraout_EAX;
}

Assistant:

void CVmBifTADS::re_match(VMG_ uint argc)
{
    const char *str;
    utf8_ptr p;
    size_t len;
    int match_len;
    vm_val_t *v1, *v2, *v3;
    int start_idx;
    CVmObjPattern *pat_obj = 0;
    const char *pat_str = 0;
    
    /* check arguments */
    check_argc_range(vmg_ argc, 2, 3);

    /* 
     *   make copies of the arguments, so we can pop the values without
     *   actually removing them from the stack - leave the originals on the
     *   stack for gc protection 
     */
    v1 = G_stk->get(0);
    v2 = G_stk->get(1);
    v3 = (argc >= 3 ? G_stk->get(2) : 0);
    G_stk->push(v2);
    G_stk->push(v1);

    /* note the starting index, if given */
    start_idx = 1;
    if (v3 != 0)
    {
        /* check the type */
        if (v3->typ != VM_INT)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get the value */
        start_idx = (int)v3->val.intval;
    }

    /* 
     *   remember the last search string (the second argument), and reset any
     *   old group registers (since they'd point into the previous string) 
     */
    G_bif_tads_globals->last_rex_str->val = *v2;
    G_bif_tads_globals->rex_searcher->clear_group_regs();

    /* 
     *   check what we have for the pattern - we could have either a string
     *   giving the regular expression, or a RexPattern object with the
     *   compiled pattern 
     */
    if (G_stk->get(0)->typ == VM_OBJ
        && CVmObjPattern::is_pattern_obj(vmg_ G_stk->get(0)->val.obj))
    {
        vm_val_t pat_val;

        /* get the pattern object */
        G_stk->pop(&pat_val);
        pat_obj = (CVmObjPattern *)vm_objp(vmg_ pat_val.val.obj);
    }
    else
    {
        /* get the pattern string */
        pat_str = pop_str_val(vmg0_);
    }

    /* get the string to match */
    str = pop_str_val(vmg0_);
    len = vmb_get_len(str);
    p.set((char *)str + VMB_LEN);

    /* if the starting index is negative, it's from the end of the string */
    start_idx += (start_idx < 0 ? (int)p.len(len) : -1);

    /* skip to the starting index */
    for ( ; start_idx > 0 && len != 0 ; --start_idx, p.inc(&len)) ;

    /* match the pattern */
    if (pat_obj != 0)
    {
        /* match the compiled pattern object */
        match_len = G_bif_tads_globals->rex_searcher->
                    match_pattern(pat_obj->get_pattern(vmg0_),
                                  str + VMB_LEN, p.getptr(), len);
    }
    else
    {
        /* match the pattern to the regular expression string */
        match_len = G_bif_tads_globals->rex_searcher->
                    compile_and_match(pat_str + VMB_LEN, vmb_get_len(pat_str),
                                      str + VMB_LEN, p.getptr(), len);
    }

    /* check for a match */
    if (match_len >= 0)
    {
        /* we got a match - calculate the character length of the match */
        retval_int(vmg_ (long)p.len(match_len));
    }
    else
    {
        /* no match - return nil */
        retval_nil(vmg0_);
    }

    /* discard the arguments */
    G_stk->discard(argc);
}